

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QString * __thiscall
QStyleSheetStyleSelector::attributeValue
          (QString *__return_storage_ptr__,QStyleSheetStyleSelector *this,NodePtr node,
          AttributeSelector *aSelector)

{
  Span *pSVar1;
  Entry *pEVar2;
  Data *pDVar3;
  NodePtr NVar4;
  char16_t *pcVar5;
  QArrayData *pQVar6;
  QHash<QString,_QString> *this_00;
  char cVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  QStyleSheetStyle *this_01;
  QStyle *pQVar11;
  qsizetype qVar12;
  ulong uVar13;
  storage_type *psVar14;
  storage_type *psVar15;
  long in_FS_OFFSET;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  const_iterator cVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  bool isNumber;
  undefined2 local_9a;
  QArrayDataPointer<QString> local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar7 = (**(code **)(*(long *)this + 0x38))(this,node.ptr);
  if (cVar7 != '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0036d178;
  }
  local_78.shared = (PrivateShared *)node;
  QHash<QObject_const*,QHash<QString,QString>>::tryEmplace_impl<QObject_const*const&>
            ((TryEmplaceResult *)&local_58,&this->m_attributeCache,(QObject **)&local_78.shared);
  this_00 = (QHash<QString,_QString> *)
            (*(long *)(*(long *)(local_58.shared + 0x20) + ((ulong)local_58._8_8_ >> 7) * 0x90 +
                      0x80) +
             (ulong)*(byte *)(*(long *)(local_58.shared + 0x20) +
                              ((ulong)local_58._8_8_ >> 7) * 0x90 +
                             (ulong)((uint)local_58._8_8_ & 0x7f)) * 0x10 + 8);
  cVar21 = QHash<QString,_QString>::constFindImpl<QString>(this_00,&aSelector->name);
  if (cVar21.i.d == (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 && cVar21.i.bucket == 0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    pcVar9 = (char *)(*(code *)**node.ptr)(node.ptr);
    QString::toLatin1_helper((QString *)local_78.data);
    iVar8 = QMetaObject::indexOfProperty(pcVar9);
    if (local_78.shared != (PrivateShared *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,1,0x10);
      }
    }
    if (iVar8 == -1) {
      QString::toLatin1_helper((QString *)&local_98);
      QObject::property((char *)local_78.data);
      ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
      ::QVariant::~QVariant((QVariant *)&local_78);
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_40 < 4) {
        if ((aSelector->name).d.size == 5) {
          pcVar5 = (aSelector->name).d.ptr;
          QVar17.m_data = pcVar5;
          QVar17.m_size = 5;
          QVar22.m_data = "class";
          QVar22.m_size = 5;
          cVar7 = QtPrivate::equalStrings(QVar17,QVar22);
          if (cVar7 == '\0') {
            QVar18.m_data = pcVar5;
            QVar18.m_size = 5;
            QVar23.m_data = "style";
            QVar23.m_size = 5;
            cVar7 = QtPrivate::equalStrings(QVar18,QVar23);
            if ((cVar7 != '\0') && ((*(byte *)(*(long *)((long)node.ptr + 8) + 0x30) & 1) != 0)) {
              QWidget::style((QWidget *)node.ptr);
              this_01 = (QStyleSheetStyle *)
                        QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
              if (this_01 != (QStyleSheetStyle *)0x0) {
                pQVar11 = QStyleSheetStyle::baseStyle(this_01);
                (*(code *)**(undefined8 **)pQVar11)(pQVar11);
                lVar10 = QMetaObject::className();
                if (lVar10 == 0) {
                  psVar15 = (storage_type *)0x0;
                }
                else {
                  psVar14 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar15 = psVar14 + 1;
                    pcVar9 = psVar14 + lVar10 + 1;
                    psVar14 = psVar15;
                  } while (*pcVar9 != '\0');
                }
                QVar20.m_data = psVar15;
                QVar20.m_size = (qsizetype)&local_78;
                QString::fromLatin1(QVar20);
                NVar4 = (NodePtr)(__return_storage_ptr__->d).d;
                pcVar5 = (__return_storage_ptr__->d).ptr;
                (__return_storage_ptr__->d).d = (Data *)local_78.shared;
                (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
                pQVar6 = (QArrayData *)(__return_storage_ptr__->d).size;
                (__return_storage_ptr__->d).size = local_78._16_8_;
                local_78.shared = (PrivateShared *)NVar4;
                local_78._8_8_ = pcVar5;
                local_78._16_8_ = pQVar6;
                goto LAB_0036cf7b;
              }
            }
          }
          else {
            local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            (*(code *)**node.ptr)(node.ptr);
            lVar10 = QMetaObject::className();
            if (lVar10 == 0) {
              psVar15 = (storage_type *)0x0;
            }
            else {
              psVar14 = (storage_type *)0xffffffffffffffff;
              do {
                psVar15 = psVar14 + 1;
                pcVar9 = psVar14 + lVar10 + 1;
                psVar14 = psVar15;
              } while (*pcVar9 != '\0');
            }
            QVar19.m_data = psVar15;
            QVar19.m_size = (qsizetype)&local_78;
            QString::fromLatin1(QVar19);
            local_98.d = (Data *)local_78._16_8_;
            local_98.ptr = (QString *)local_78._8_8_;
            qVar12 = QStringView::indexOf((QStringView *)&local_98,(QChar)0x3a,0,CaseSensitive);
            if (qVar12 != -1) {
              QString::replace((QChar)(char16_t)&local_78,(QChar)0x3a,0x2d);
            }
            QString::operator=(__return_storage_ptr__,(QString *)local_78.data);
LAB_0036cf7b:
            if (local_78.shared != (PrivateShared *)0x0) {
              LOCK();
              *(int *)local_78.shared = *(int *)local_78.shared + -1;
              UNLOCK();
              if (*(int *)local_78.shared == 0) {
                QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
              }
            }
          }
        }
        goto LAB_0036cf99;
      }
LAB_0036cfa5:
      iVar8 = ::QVariant::typeId((QVariant *)&local_58);
      if ((iVar8 == 0xb) || (iVar8 = ::QVariant::typeId((QVariant *)&local_58), iVar8 == 9)) {
        ::QVariant::toStringList();
        local_9a = 0x20;
        QtPrivate::QStringList_join
                  ((QList_conflict *)local_78.data,(QChar *)&local_98,(longlong)&local_9a);
        NVar4 = (NodePtr)(__return_storage_ptr__->d).d;
        pcVar5 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_78.shared;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
        pQVar6 = (QArrayData *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_78._16_8_;
        local_78.shared = (PrivateShared *)NVar4;
        local_78._8_8_ = pcVar5;
        local_78._16_8_ = pQVar6;
        if ((QArrayData *)NVar4.ptr != (QArrayData *)0x0) {
          LOCK();
          *(int *)NVar4.ptr = *NVar4.ptr + -1;
          UNLOCK();
          if (*NVar4.ptr == 0) {
            QArrayData::deallocate((QArrayData *)NVar4.ptr,2,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      }
      else {
        ::QVariant::toString();
        NVar4 = (NodePtr)(__return_storage_ptr__->d).d;
        pcVar5 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_78.shared;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
        pQVar6 = (QArrayData *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_78._16_8_;
        local_78.shared = (PrivateShared *)NVar4;
        local_78._8_8_ = pcVar5;
        local_78._16_8_ = pQVar6;
        if ((QArrayData *)NVar4.ptr != (QArrayData *)0x0) {
          LOCK();
          *(int *)NVar4.ptr = *NVar4.ptr + -1;
          UNLOCK();
          if (*NVar4.ptr == 0) {
            QArrayData::deallocate((QArrayData *)NVar4.ptr,2,0x10);
          }
        }
      }
    }
    else {
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uStack_60 = 0xaaaaaaaa;
      uStack_5c = 0xaaaaaaaa;
      local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (*(code *)**node.ptr)(node.ptr);
      QMetaObject::property((int)&local_78);
      QMetaProperty::read((QObject *)&local_98);
      ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_98);
      ::QVariant::~QVariant((QVariant *)&local_98);
      cVar7 = QMetaProperty::isEnumType();
      if (cVar7 != '\0') {
        local_98.d = (Data *)CONCAT71(local_98.d._1_7_,0xaa);
        QVar16.m_data = (aSelector->value).d.ptr;
        QVar16.m_size = (aSelector->value).d.size;
        lVar10 = QString::toIntegral_helper(QVar16,(bool *)&local_98,10);
        if (((int)lVar10 == lVar10) && (((ulong)local_98.d & 1) != 0)) {
          ::QVariant::convert((QMetaTypeInterface *)&local_58);
        }
      }
LAB_0036cf99:
      if (3 < local_40) goto LAB_0036cfa5;
    }
    QHash<QString,QString>::tryEmplace_impl<QString_const&>
              ((TryEmplaceResult *)&local_78,this_00,&aSelector->name);
    lVar10 = ((ulong)local_78._8_8_ >> 7) * 0x90;
    QString::operator=((QString *)
                       (*(long *)(*(long *)(local_78.shared + 0x20) + 0x80 + lVar10) +
                        (ulong)((uint)*(byte *)((ulong)((uint)local_78._8_8_ & 0x7f) +
                                               *(long *)(local_78.shared + 0x20) + lVar10) * 0x30) +
                       0x18),(QString *)__return_storage_ptr__);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    pSVar1 = (cVar21.i.d)->spans;
    uVar13 = cVar21.i.bucket >> 7;
    pEVar2 = pSVar1[uVar13].entries;
    uVar13 = (ulong)((uint)pSVar1[uVar13].offsets[(uint)cVar21.i.bucket & 0x7f] * 0x30);
    pDVar3 = *(Data **)((pEVar2->storage).data + uVar13 + 0x18);
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = *(char16_t **)((pEVar2->storage).data + uVar13 + 0x20);
    (__return_storage_ptr__->d).size = *(qsizetype *)((pEVar2->storage).data + uVar13 + 0x28);
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0036d178:
  __stack_chk_fail();
}

Assistant:

QString attributeValue(NodePtr node, const QCss::AttributeSelector& aSelector) const override
    {
        if (isNullNode(node))
            return QString();

        const QString &name = aSelector.name;
        QHash<QString, QString> &cache = m_attributeCache[OBJECT_PTR(node)];
        QHash<QString, QString>::const_iterator cacheIt = cache.constFind(name);
        if (cacheIt != cache.constEnd())
            return cacheIt.value();

        QVariant value;
        QString valueStr;
        QObject *obj = OBJECT_PTR(node);
        const int propertyIndex = obj->metaObject()->indexOfProperty(name.toLatin1());
        if (propertyIndex == -1) {
            value = obj->property(name.toLatin1()); // might be a dynamic property
            if (!value.isValid()) {
                if (name == "class"_L1) {
                    QString className = QString::fromLatin1(obj->metaObject()->className());
                    if (className.contains(u':'))
                        className.replace(u':', u'-');
                    valueStr = className;
                } else if (name == "style"_L1) {
                    QWidget *w = qobject_cast<QWidget *>(obj);
                    QStyleSheetStyle *proxy = w ? qt_styleSheet(w->style()) : nullptr;
                    if (proxy)
                        valueStr = QString::fromLatin1(proxy->baseStyle()->metaObject()->className());
                }
            }
        } else {
            const QMetaProperty property = obj->metaObject()->property(propertyIndex);
            value = property.read(obj);
            // support Qt 5 selector syntax, which required the integer enum value
            if (property.isEnumType()) {
                bool isNumber;
                aSelector.value.toInt(&isNumber);
                if (isNumber)
                    value.convert(QMetaType::fromType<int>());
            }
        }
        if (value.isValid()) {
            valueStr = (value.userType() == QMetaType::QStringList
                        || value.userType() == QMetaType::QVariantList)
                        ? value.toStringList().join(u' ')
                        : value.toString();
        }
        cache[name] = valueStr;
        return valueStr;
    }